

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ClassesCollectOneClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,Vec_Ptr_t *vRoots)

{
  int iVar1;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vRoots_local;
  Aig_Obj_t *pRepr_local;
  Dch_Cla_t *p_local;
  
  Vec_PtrClear(vRoots);
  for (local_2c = 0; local_2c < p->pClassSizes[pRepr->Id]; local_2c = local_2c + 1) {
    if (p->pId2Class[pRepr->Id][local_2c] != (Aig_Obj_t *)0x0) {
      Vec_PtrPush(vRoots,p->pId2Class[pRepr->Id][local_2c]);
    }
  }
  iVar1 = Vec_PtrSize(vRoots);
  if (iVar1 < 2) {
    __assert_fail("Vec_PtrSize(vRoots) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x214,"void Dch_ClassesCollectOneClass(Dch_Cla_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Dch_ClassesCollectOneClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, Vec_Ptr_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vRoots );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Vec_PtrPush( vRoots, pObj );
    assert( Vec_PtrSize(vRoots) > 1 ); 
}